

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  int iVar1;
  uint32_t uVar2;
  Size SVar3;
  Clause *pCVar4;
  char *pcVar5;
  vec<unsigned_int,_int> *this_00;
  Solver *in_RDI;
  vec<unsigned_int,_int> *cs;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff88;
  CRef in_stack_ffffffffffffff8c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *in_stack_ffffffffffffff90;
  ClauseAllocator *in_stack_ffffffffffffffc8;
  Queue<unsigned_int> *in_stack_ffffffffffffffd0;
  int local_10;
  int local_c;
  
  if (in_RDI[1].trail.cap != 0) {
    for (local_c = 0;
        iVar1 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff90),
        local_c < iVar1; local_c = local_c + 1) {
      in_stack_ffffffffffffffd0 = (Queue<unsigned_int> *)&in_RDI->ca;
      Queue<unsigned_int>::operator[]
                ((Queue<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      pCVar4 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      uVar2 = Clause::mark(pCVar4);
      if (uVar2 == 0) {
        in_stack_ffffffffffffffc8 = &in_RDI->ca;
        Queue<unsigned_int>::operator[]
                  ((Queue<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        pCVar4 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        Clause::mark(pCVar4,2);
      }
    }
    for (local_c = 0; iVar1 = Solver::nVars(in_RDI), local_c < iVar1; local_c = local_c + 1) {
      pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         ((IntMap<int,_char,_Minisat::MkIndexDefault<int>_> *)
                          in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (*pcVar5 != '\0') {
        this_00 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                  ::lookup(in_stack_ffffffffffffff90,
                           (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        for (local_10 = 0; SVar3 = vec<unsigned_int,_int>::size(this_00), local_10 < SVar3;
            local_10 = local_10 + 1) {
          vec<unsigned_int,_int>::operator[](this_00,local_10);
          pCVar4 = ClauseAllocator::operator[]
                             ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                             );
          uVar2 = Clause::mark(pCVar4);
          if (uVar2 == 0) {
            vec<unsigned_int,_int>::operator[](this_00,local_10);
            Queue<unsigned_int>::insert
                      (in_stack_ffffffffffffffd0,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
            vec<unsigned_int,_int>::operator[](this_00,local_10);
            pCVar4 = ClauseAllocator::operator[]
                               ((ClauseAllocator *)in_stack_ffffffffffffff90,
                                in_stack_ffffffffffffff8c);
            Clause::mark(pCVar4,2);
          }
        }
        pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           ((IntMap<int,_char,_Minisat::MkIndexDefault<int>_> *)
                            in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        *pcVar5 = '\0';
      }
    }
    for (local_c = 0;
        iVar1 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff90),
        local_c < iVar1; local_c = local_c + 1) {
      Queue<unsigned_int>::operator[]
                ((Queue<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      pCVar4 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      uVar2 = Clause::mark(pCVar4);
      if (uVar2 == 2) {
        in_stack_ffffffffffffff90 =
             (OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
              *)&in_RDI->ca;
        Queue<unsigned_int>::operator[]
                  ((Queue<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        pCVar4 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        Clause::mark(pCVar4,0);
      }
    }
    in_RDI[1].trail.cap = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < nVars(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}